

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O2

void cmime_message_set_boundary(CMimeMessage_T *message,char *boundary)

{
  char *pcVar1;
  char *pcVar2;
  char *local_20;
  char *s;
  
  local_20 = (char *)0x0;
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x2df,"void cmime_message_set_boundary(CMimeMessage_T *, const char *)");
  }
  if (boundary != (char *)0x0) {
    free(message->boundary);
    pcVar1 = strdup(boundary);
    message->boundary = pcVar1;
    pcVar2 = "\r\n";
    if (message->linebreak != (char *)0x0) {
      pcVar2 = message->linebreak;
    }
    asprintf(&local_20,"multipart/mixed;%s\tboundary=\"%s\"",pcVar2,pcVar1);
    _cmime_internal_set_linked_header_value(message->headers,"Content-Type",local_20);
    _rebuild_first_part(message);
    free(local_20);
    return;
  }
  __assert_fail("boundary",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x2e0,"void cmime_message_set_boundary(CMimeMessage_T *, const char *)");
}

Assistant:

void cmime_message_set_boundary(CMimeMessage_T *message, const char *boundary) {
    char *s = NULL;
    char *nl = NULL;

    assert(message);
    assert(boundary);
    
    if (message->boundary != NULL)
        free(message->boundary);
        
    message->boundary = strdup(boundary);

    if (message->linebreak)
        nl = message->linebreak;
    else
        nl = CRLF;
    
    asprintf(&s,"multipart/mixed;%s\tboundary=\"%s\"",nl,message->boundary);
    _cmime_internal_set_linked_header_value(message->headers,"Content-Type",s);

    _rebuild_first_part(message);
    free(s);
}